

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_quaternion.c
# Opt level: O3

char * test_quaternion_360_degree_eulers(void)

{
  short sVar1;
  char *pcVar2;
  double out_anglez;
  double out_angley;
  double out_anglex;
  quaternion q1;
  double local_48;
  double local_40;
  double local_38;
  quaternion local_30;
  
  quaternion_set_from_euler_anglesf3(&local_30,0.0,6.370451927185059,0.0);
  quaternion_get_euler_anglesf3(&local_30,&local_38,&local_40,&local_48);
  sVar1 = scalar_equalsf(0.0,local_38);
  if (sVar1 == 0) {
    pcVar2 = 
    "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(432) : (assertion failed) ((scalar_equalsf(0.0f, out_anglex)))"
    ;
  }
  else {
    sVar1 = scalar_equalsf(5.0,local_40 * 57.295780181884766);
    if (sVar1 == 0) {
      pcVar2 = 
      "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(435) : (assertion failed) ((scalar_equalsf(5.0f, ((out_angley) * 57.2957795130823208767981548141052f))))"
      ;
    }
    else {
      sVar1 = scalar_equalsf(0.0,local_48);
      pcVar2 = (char *)0x0;
      if (sVar1 == 0) {
        pcVar2 = 
        "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(437) : (assertion failed) ((scalar_equalsf(0.0f, out_anglez)))"
        ;
      }
    }
  }
  return pcVar2;
}

Assistant:

static char *test_quaternion_360_degree_eulers(void)
{
	struct quaternion q1;
	HYP_FLOAT out_anglex, out_angley, out_anglez;

	/* set the original quaternions with the eulers */
	quaternion_set_from_euler_anglesf3(&q1, 0.0f, HYP_DEG_TO_RAD(365.0f), 0.0f);

	/* get the angles */
	quaternion_get_euler_anglesf3(&q1, &out_anglex, &out_angley, &out_anglez);

	test_assert(scalar_equals(0.0f, out_anglex));

	/* should be 5 degrees, quaternion will normalize the value */
	test_assert(scalar_equals(5.0f, HYP_RAD_TO_DEG(out_angley)));

	test_assert(scalar_equals(0.0f, out_anglez));

	return NULL;
}